

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall
Query::prefetch(Query *this,int from_index,int howmany,bool only_last,PrefetchFunc *prefetcher)

{
  int iVar1;
  PrimitiveQuery __args;
  PrimitiveQuery PVar2;
  const_reference pvVar3;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  function<void_(PrimitiveQuery)> *in_R8;
  int ndx;
  int i;
  function<void_(PrimitiveQuery)> *this_00;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_EDX <= local_24) {
      return;
    }
    iVar1 = local_24 + in_ESI;
    __args = (PrimitiveQuery)(long)iVar1;
    PVar2 = (PrimitiveQuery)
            Catch::clara::std::vector<Query,_std::allocator<Query>_>::size
                      ((vector<Query,_std::allocator<Query>_> *)(in_RDI + 0x30));
    if ((ulong)PVar2 <= (ulong)__args) break;
    pvVar3 = std::vector<Query,_std::allocator<Query>_>::operator[]
                       ((vector<Query,_std::allocator<Query>_> *)(in_RDI + 0x30),(long)iVar1);
    if ((pvVar3->type == PRIMITIVE) && (((in_CL & 1) == 0 || (local_24 + 1 == in_EDX)))) {
      this_00 = in_R8;
      std::vector<Query,_std::allocator<Query>_>::operator[]
                ((vector<Query,_std::allocator<Query>_> *)(in_RDI + 0x30),(long)iVar1);
      std::function<void_(PrimitiveQuery)>::operator()(this_00,__args);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Query::prefetch(int from_index, int howmany, bool only_last,
                     const PrefetchFunc &prefetcher) const {
    for (int i = 0; i < howmany; i++) {
        int ndx = i + from_index;
        if (ndx >= queries.size()) {
            break;
        }
        if (queries[ndx].type == QueryType::PRIMITIVE) {
            if (only_last && (i + 1 != howmany)) {
                continue;
            }
            prefetcher(queries[ndx].ngram);
        }
    }
}